

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gha.c
# Opt level: O0

int gha_adjust_info_newton_md(float *pcm,gha_info *info,size_t dim,gha_ctx_t ctx)

{
  void *__dest;
  double *x;
  double *a;
  gha_info *__src;
  int iVar1;
  float *pfVar2;
  long lVar3;
  long lVar4;
  size_t __n;
  undefined1 *puVar5;
  size_t n_00;
  double *pdVar6;
  float fVar7;
  double dVar8;
  undefined1 auStack_258 [8];
  double *local_250;
  unsigned_long local_248;
  double *local_240;
  float local_238;
  float local_234;
  float local_230;
  float local_22c;
  size_t local_228;
  float local_220;
  float local_21c;
  size_t local_218;
  float local_210;
  float local_20c;
  undefined4 local_208;
  undefined4 uStack_204;
  undefined4 uStack_200;
  undefined4 uStack_1fc;
  float local_1f4;
  size_t local_1f0;
  float local_1e8;
  float local_1e4;
  float local_1e0;
  float local_1dc;
  float local_1d8;
  float local_1d4;
  float local_1d0;
  float local_1cc;
  unsigned_long local_1c8;
  long local_1c0;
  unsigned_long local_1b8;
  long local_1b0;
  unsigned_long local_1a8;
  long local_1a0;
  unsigned_long local_198;
  long local_190;
  unsigned_long local_188;
  long local_180;
  unsigned_long local_178;
  long local_170;
  unsigned_long local_168;
  long local_160;
  long local_158;
  long local_150;
  int local_144;
  long local_140;
  unsigned_long __vla_expr18;
  unsigned_long __vla_expr17;
  unsigned_long __vla_expr16;
  float local_120;
  float c;
  float s;
  float pk;
  float wk;
  float Ak;
  unsigned_long __vla_expr15;
  unsigned_long __vla_expr14;
  unsigned_long __vla_expr13;
  unsigned_long __vla_expr12;
  unsigned_long __vla_expr11;
  unsigned_long __vla_expr10;
  unsigned_long __vla_expr9;
  unsigned_long __vla_expr8;
  unsigned_long __vla_expr7;
  unsigned_long __vla_expr6;
  unsigned_long __vla_expr5;
  unsigned_long __vla_expr4;
  unsigned_long __vla_expr3;
  unsigned_long __vla_expr2;
  unsigned_long __vla_expr1;
  unsigned_long __vla_expr0;
  undefined8 local_88;
  size_t MAX_LOOPS;
  size_t n;
  size_t k;
  size_t j;
  size_t i;
  size_t loop;
  gha_ctx_t ctx_local;
  size_t dim_local;
  gha_info *info_local;
  float *pcm_local;
  
  local_88 = 7;
  i = 0;
  puVar5 = auStack_258;
  loop = (size_t)ctx;
  ctx_local = (gha_ctx_t)dim;
  dim_local = (size_t)info;
  info_local = (gha_info *)pcm;
  while( true ) {
    __src = info_local;
    if (6 < i) {
      return 0;
    }
    lVar3 = *(long *)loop;
    __dest = *(void **)(loop + 0x28);
    *(undefined8 *)(puVar5 + -8) = 0x101bc7;
    memcpy(__dest,__src,lVar3 << 2);
    local_1c8 = *(unsigned_long *)loop;
    local_1c0 = (long)puVar5 - ((long)ctx_local * local_1c8 * 4 + 0xf & 0xfffffffffffffff0);
    __vla_expr1 = (unsigned_long)ctx_local;
    local_1b8 = *(unsigned_long *)loop;
    local_1b0 = local_1c0 - ((long)ctx_local * local_1b8 * 4 + 0xf & 0xfffffffffffffff0);
    __vla_expr3 = (unsigned_long)ctx_local;
    local_1a8 = *(unsigned_long *)loop;
    local_1a0 = local_1b0 - ((long)ctx_local * local_1a8 * 4 + 0xf & 0xfffffffffffffff0);
    __vla_expr5 = (unsigned_long)ctx_local;
    local_198 = *(unsigned_long *)loop;
    local_190 = local_1a0 - ((long)ctx_local * local_198 * 4 + 0xf & 0xfffffffffffffff0);
    __vla_expr7 = (unsigned_long)ctx_local;
    local_188 = *(unsigned_long *)loop;
    local_180 = local_190 - ((long)ctx_local * local_188 * 4 + 0xf & 0xfffffffffffffff0);
    __vla_expr9 = (unsigned_long)ctx_local;
    local_178 = *(unsigned_long *)loop;
    local_170 = local_180 - ((long)ctx_local * local_178 * 4 + 0xf & 0xfffffffffffffff0);
    __vla_expr11 = (unsigned_long)ctx_local;
    local_168 = *(unsigned_long *)loop;
    local_160 = local_170 - ((long)ctx_local * local_168 * 4 + 0xf & 0xfffffffffffffff0);
    __vla_expr13 = (unsigned_long)ctx_local;
    local_158 = *(long *)loop;
    lVar3 = local_160 - ((long)ctx_local * local_158 * 4 + 0xfU & 0xfffffffffffffff0);
    __vla_expr15 = (unsigned_long)ctx_local;
    local_150 = lVar3;
    _wk = local_158;
    __vla_expr14 = local_168;
    __vla_expr12 = local_178;
    __vla_expr10 = local_188;
    __vla_expr8 = local_198;
    __vla_expr6 = local_1a8;
    __vla_expr4 = local_1b8;
    __vla_expr2 = local_1c8;
    __vla_expr0 = (unsigned_long)puVar5;
    for (MAX_LOOPS = 0; MAX_LOOPS < *(ulong *)loop; MAX_LOOPS = MAX_LOOPS + 1) {
      for (n = 0; n < ctx_local; n = n + 1) {
        pk = *(float *)(dim_local + 8 + n * 0xc);
        local_1d4 = *(float *)(dim_local + n * 0xc);
        c = *(float *)(dim_local + 4 + n * 0xc);
        local_1d0 = (float)(long)MAX_LOOPS;
        local_1cc = (float)MAX_LOOPS;
        fVar7 = local_1d4 * local_1cc + c;
        s = local_1d4;
        *(undefined8 *)(lVar3 + -8) = 0x101ee3;
        dVar8 = sin((double)fVar7);
        local_120 = (float)dVar8;
        local_1e0 = s;
        local_1dc = (float)(long)MAX_LOOPS;
        local_1d8 = (float)MAX_LOOPS;
        fVar7 = s * local_1d8 + c;
        *(undefined8 *)(lVar3 + -8) = 0x101f6d;
        dVar8 = cos((double)fVar7);
        __vla_expr16._4_4_ = (float)dVar8;
        *(float *)(*(long *)(loop + 0x28) + MAX_LOOPS * 4) =
             *(float *)(*(long *)(loop + 0x28) + MAX_LOOPS * 4) - pk * local_120;
        local_208 = 0x80000000;
        uStack_204 = 0x80000000;
        uStack_200 = 0x80000000;
        uStack_1fc = 0x80000000;
        *(float *)(local_1c0 + n * local_1c8 * 4 + MAX_LOOPS * 4) = -local_120;
        local_1f4 = -pk;
        local_1f0 = MAX_LOOPS;
        local_1e8 = (float)(long)MAX_LOOPS;
        local_1e4 = (float)MAX_LOOPS;
        *(float *)(local_1b0 + n * local_1b8 * 4 + MAX_LOOPS * 4) =
             local_1f4 * local_1e4 * __vla_expr16._4_4_;
        *(float *)(local_1a0 + n * local_1a8 * 4 + MAX_LOOPS * 4) = -pk * __vla_expr16._4_4_;
        local_218 = MAX_LOOPS;
        local_20c = (float)-MAX_LOOPS;
        local_210 = (float)(long)-MAX_LOOPS;
        if ((long)MAX_LOOPS < 1) {
          local_20c = local_210;
        }
        *(float *)(local_190 + n * local_198 * 4 + MAX_LOOPS * 4) = local_20c * __vla_expr16._4_4_;
        *(float *)(local_180 + n * local_188 * 4 + MAX_LOOPS * 4) = -__vla_expr16._4_4_;
        local_22c = pk;
        local_228 = MAX_LOOPS;
        local_220 = (float)(long)MAX_LOOPS;
        local_21c = (float)MAX_LOOPS;
        *(float *)(local_170 + n * local_178 * 4 + MAX_LOOPS * 4) =
             pk * local_21c * local_21c * local_120;
        local_238 = pk;
        local_234 = (float)(long)MAX_LOOPS;
        local_230 = (float)MAX_LOOPS;
        *(float *)(local_160 + local_168 * n * 4 + MAX_LOOPS * 4) = pk * local_230 * local_120;
        *(float *)(local_150 + local_158 * n * 4 + MAX_LOOPS * 4) = pk * local_120;
      }
    }
    __vla_expr17 = (long)ctx_local * 3;
    local_248 = (long)ctx_local * 3 + 1;
    pdVar6 = (double *)(lVar3 - (__vla_expr17 * local_248 * 8 + 0xf & 0xfffffffffffffff0));
    lVar4 = (long)ctx_local * 3;
    lVar3 = (long)ctx_local * 3;
    local_240 = pdVar6;
    __vla_expr18 = local_248;
    pdVar6[-1] = 5.22554459111745e-318;
    memset(pdVar6,0,lVar4 * (lVar3 + 1) * 8);
    for (j = 0; j < ctx_local; j = j + 1) {
      for (k = 0; k < ctx_local; k = k + 1) {
        for (MAX_LOOPS = 0; MAX_LOOPS < *(ulong *)loop; MAX_LOOPS = MAX_LOOPS + 1) {
          if (j == k) {
            local_240[j * local_248 + k] =
                 (double)(*(float *)(local_1c0 + local_1c8 * j * 4 + MAX_LOOPS * 4) *
                         *(float *)(local_1c0 + local_1c8 * j * 4 + MAX_LOOPS * 4)) +
                 local_240[j * local_248 + k];
            local_240[(long)&ctx_local->size + j * local_248 + k] =
                 (double)(*(float *)(*(long *)(loop + 0x28) + MAX_LOOPS * 4) *
                          *(float *)(local_190 + local_198 * j * 4 + MAX_LOOPS * 4) +
                         *(float *)(local_1c0 + local_1c8 * j * 4 + MAX_LOOPS * 4) *
                         *(float *)(local_1b0 + local_1b8 * j * 4 + MAX_LOOPS * 4)) +
                 local_240[(long)&ctx_local->size + j * local_248 + k];
            lVar3 = k + (long)ctx_local * 2;
            local_240[j * local_248 + lVar3] =
                 (double)(*(float *)(*(long *)(loop + 0x28) + MAX_LOOPS * 4) *
                          *(float *)(local_180 + local_188 * j * 4 + MAX_LOOPS * 4) +
                         *(float *)(local_1c0 + local_1c8 * j * 4 + MAX_LOOPS * 4) *
                         *(float *)(local_1a0 + local_1a8 * j * 4 + MAX_LOOPS * 4)) +
                 local_240[j * local_248 + lVar3];
            lVar3 = ((long)&ctx_local->size + j) * local_248;
            local_240[(long)&ctx_local->size + lVar3 + k] =
                 (double)(*(float *)(*(long *)(loop + 0x28) + MAX_LOOPS * 4) *
                          *(float *)(local_170 + local_178 * j * 4 + MAX_LOOPS * 4) +
                         *(float *)(local_1b0 + local_1b8 * j * 4 + MAX_LOOPS * 4) *
                         *(float *)(local_1b0 + local_1b8 * j * 4 + MAX_LOOPS * 4)) +
                 local_240[(long)&ctx_local->size + lVar3 + k];
            lVar3 = ((long)&ctx_local->size + j) * local_248;
            lVar4 = k + (long)ctx_local * 2;
            local_240[lVar3 + lVar4] =
                 (double)(*(float *)(*(long *)(loop + 0x28) + MAX_LOOPS * 4) *
                          *(float *)(local_160 + local_168 * j * 4 + MAX_LOOPS * 4) +
                         *(float *)(local_1b0 + local_1b8 * j * 4 + MAX_LOOPS * 4) *
                         *(float *)(local_1a0 + local_1a8 * j * 4 + MAX_LOOPS * 4)) +
                 local_240[lVar3 + lVar4];
            lVar3 = (j + (long)ctx_local * 2) * local_248;
            lVar4 = k + (long)ctx_local * 2;
            local_240[lVar3 + lVar4] =
                 (double)(*(float *)(*(long *)(loop + 0x28) + MAX_LOOPS * 4) *
                          *(float *)(local_150 + local_158 * j * 4 + MAX_LOOPS * 4) +
                         *(float *)(local_1a0 + local_1a8 * j * 4 + MAX_LOOPS * 4) *
                         *(float *)(local_1a0 + local_1a8 * j * 4 + MAX_LOOPS * 4)) +
                 local_240[lVar3 + lVar4];
          }
          else {
            local_240[j * local_248 + k] =
                 (double)(*(float *)(local_1c0 + local_1c8 * j * 4 + MAX_LOOPS * 4) *
                         *(float *)(local_1c0 + local_1c8 * k * 4 + MAX_LOOPS * 4)) +
                 local_240[j * local_248 + k];
            local_240[(long)&ctx_local->size + j * local_248 + k] =
                 (double)(*(float *)(local_1c0 + local_1c8 * j * 4 + MAX_LOOPS * 4) *
                         *(float *)(local_1b0 + local_1b8 * k * 4 + MAX_LOOPS * 4)) +
                 local_240[(long)&ctx_local->size + j * local_248 + k];
            lVar3 = k + (long)ctx_local * 2;
            local_240[j * local_248 + lVar3] =
                 (double)(*(float *)(local_1c0 + local_1c8 * j * 4 + MAX_LOOPS * 4) *
                         *(float *)(local_1a0 + local_1a8 * k * 4 + MAX_LOOPS * 4)) +
                 local_240[j * local_248 + lVar3];
            lVar3 = ((long)&ctx_local->size + j) * local_248;
            local_240[(long)&ctx_local->size + lVar3 + k] =
                 (double)(*(float *)(local_1b0 + local_1b8 * j * 4 + MAX_LOOPS * 4) *
                         *(float *)(local_1b0 + local_1b8 * k * 4 + MAX_LOOPS * 4)) +
                 local_240[(long)&ctx_local->size + lVar3 + k];
            lVar3 = ((long)&ctx_local->size + j) * local_248;
            lVar4 = k + (long)ctx_local * 2;
            local_240[lVar3 + lVar4] =
                 (double)(*(float *)(local_1b0 + local_1b8 * j * 4 + MAX_LOOPS * 4) *
                         *(float *)(local_1a0 + local_1a8 * k * 4 + MAX_LOOPS * 4)) +
                 local_240[lVar3 + lVar4];
            lVar3 = (j + (long)ctx_local * 2) * local_248;
            lVar4 = k + (long)ctx_local * 2;
            local_240[lVar3 + lVar4] =
                 (double)(*(float *)(local_1a0 + local_1a8 * j * 4 + MAX_LOOPS * 4) *
                         *(float *)(local_1a0 + local_1a8 * k * 4 + MAX_LOOPS * 4)) +
                 local_240[lVar3 + lVar4];
          }
        }
        local_240[j * local_248 + k] = local_240[j * local_248 + k] * 2.0;
        local_240[(long)&ctx_local->size + j * local_248 + k] =
             local_240[(long)&ctx_local->size + j * local_248 + k] * 2.0;
        lVar3 = k + (long)ctx_local * 2;
        local_240[j * local_248 + lVar3] = local_240[j * local_248 + lVar3] * 2.0;
        lVar3 = ((long)&ctx_local->size + j) * local_248;
        local_240[(long)&ctx_local->size + lVar3 + k] =
             local_240[(long)&ctx_local->size + lVar3 + k] * 2.0;
        lVar3 = ((long)&ctx_local->size + j) * local_248;
        lVar4 = k + (long)ctx_local * 2;
        local_240[lVar3 + lVar4] = local_240[lVar3 + lVar4] * 2.0;
        lVar3 = (j + (long)ctx_local * 2) * local_248;
        lVar4 = k + (long)ctx_local * 2;
        local_240[lVar3 + lVar4] = local_240[lVar3 + lVar4] * 2.0;
        local_240[(long)&ctx_local->size + j * local_248 + k] =
             local_240[((long)&ctx_local->size + j) * local_248 + k];
        local_240[j * local_248 + k + (long)ctx_local * 2] =
             local_240[(j + (long)ctx_local * 2) * local_248 + k];
        local_240[((long)&ctx_local->size + j) * local_248 + k + (long)ctx_local * 2] =
             local_240[(long)&ctx_local->size + (j + (long)ctx_local * 2) * local_248 + k];
      }
    }
    for (n = 0; n < ctx_local; n = n + 1) {
      for (MAX_LOOPS = 0; MAX_LOOPS < *(ulong *)loop; MAX_LOOPS = MAX_LOOPS + 1) {
        local_240[n * local_248 + (long)ctx_local * 3] =
             (double)(*(float *)(*(long *)(loop + 0x28) + MAX_LOOPS * 4) *
                     *(float *)(local_1c0 + local_1c8 * n * 4 + MAX_LOOPS * 4)) +
             local_240[n * local_248 + (long)ctx_local * 3];
        lVar3 = ((long)&ctx_local->size + n) * local_248;
        local_240[lVar3 + (long)ctx_local * 3] =
             (double)(*(float *)(*(long *)(loop + 0x28) + MAX_LOOPS * 4) *
                     *(float *)(local_1b0 + local_1b8 * n * 4 + MAX_LOOPS * 4)) +
             local_240[lVar3 + (long)ctx_local * 3];
        lVar3 = (n + (long)ctx_local * 2) * local_248;
        local_240[lVar3 + (long)ctx_local * 3] =
             (double)(*(float *)(*(long *)(loop + 0x28) + MAX_LOOPS * 4) *
                     *(float *)(local_1a0 + local_1a8 * n * 4 + MAX_LOOPS * 4)) +
             local_240[lVar3 + (long)ctx_local * 3];
      }
      local_240[n * local_248 + (long)ctx_local * 3] =
           local_240[n * local_248 + (long)ctx_local * 3] * 2.0;
      lVar3 = ((long)&ctx_local->size + n) * local_248;
      local_240[lVar3 + (long)ctx_local * 3] = local_240[lVar3 + (long)ctx_local * 3] * 2.0;
      lVar3 = (n + (long)ctx_local * 2) * local_248;
      local_240[lVar3 + (long)ctx_local * 3] = local_240[lVar3 + (long)ctx_local * 3] * 2.0;
    }
    local_140 = (long)ctx_local * 3;
    pdVar6 = (double *)((long)pdVar6 - ((long)ctx_local * 0x18 + 0xfU & 0xfffffffffffffff0));
    __n = (long)ctx_local * 0x18;
    local_250 = pdVar6;
    pdVar6[-1] = 5.24113730290019e-318;
    memset(pdVar6,0,__n);
    a = local_240;
    x = local_250;
    n_00 = (long)ctx_local * 3;
    pdVar6[-1] = 5.24134481047145e-318;
    iVar1 = sle_solve(a,n_00,x);
    if (iVar1 == 0) {
      for (n = 0; n < ctx_local; n = n + 1) {
        lVar3 = dim_local + n * 0xc;
        *(float *)(lVar3 + 8) = (float)(-local_250[n] * 0.8 + (double)*(float *)(lVar3 + 8));
        pfVar2 = (float *)(dim_local + n * 0xc);
        *pfVar2 = (float)(-local_250[(long)&ctx_local->size + n] * 0.8 + (double)*pfVar2);
        lVar3 = dim_local + n * 0xc;
        *(float *)(lVar3 + 4) =
             (float)(-local_250[n + (long)ctx_local * 2] * 0.8 + (double)*(float *)(lVar3 + 4));
      }
      for (n = 0; n < ctx_local; n = n + 1) {
        pfVar2 = (float *)(dim_local + n * 0xc + 8);
        if (*pfVar2 <= 0.0 && *pfVar2 != 0.0) {
          lVar3 = dim_local + n * 0xc;
          *(float *)(lVar3 + 8) = *(float *)(lVar3 + 8) * -1.0;
          lVar3 = dim_local + n * 0xc;
          *(float *)(lVar3 + 4) = *(float *)(lVar3 + 4) + 3.1415927;
        }
        if (1.0 < *(float *)(dim_local + n * 0xc + 8)) {
          *(undefined4 *)(dim_local + n * 0xc + 8) = 0x3f000000;
        }
      }
      for (n = 0; n < ctx_local; n = n + 1) {
        pfVar2 = (float *)(dim_local + n * 0xc);
        if (*pfVar2 <= 0.0 && *pfVar2 != 0.0) {
          pfVar2 = (float *)(dim_local + n * 0xc);
          *pfVar2 = *pfVar2 * -1.0;
          *(float *)(dim_local + n * 0xc + 4) = 6.2831855 - *(float *)(dim_local + n * 0xc + 4);
        }
        while (6.2831855 < *(float *)(dim_local + n * 0xc)) {
          pfVar2 = (float *)(dim_local + n * 0xc);
          *pfVar2 = *pfVar2 - 6.2831855;
        }
        if (3.1415927 < *(float *)(dim_local + n * 0xc)) {
          *(float *)(dim_local + n * 0xc) = 6.2831855 - *(float *)(dim_local + n * 0xc);
        }
      }
      for (n = 0; n < ctx_local; n = n + 1) {
        while (6.2831855 < *(float *)(dim_local + n * 0xc + 4)) {
          lVar3 = dim_local + n * 0xc;
          *(float *)(lVar3 + 4) = *(float *)(lVar3 + 4) - 6.2831855;
        }
        while (pfVar2 = (float *)(dim_local + n * 0xc + 4), *pfVar2 <= 0.0 && *pfVar2 != 0.0) {
          lVar3 = dim_local + n * 0xc;
          *(float *)(lVar3 + 4) = *(float *)(lVar3 + 4) + 6.2831855;
        }
      }
      local_144 = 0;
    }
    else {
      pcm_local._4_4_ = -1;
      local_144 = 1;
    }
    if (local_144 != 0) break;
    i = i + 1;
    puVar5 = (undefined1 *)__vla_expr0;
  }
  return pcm_local._4_4_;
}

Assistant:

int gha_adjust_info_newton_md(const FLOAT* pcm, struct gha_info* info, size_t dim, gha_ctx_t ctx)
{
	size_t loop;
	size_t i, j, k, n;

	const size_t MAX_LOOPS = 7;

	for (loop = 0; loop < MAX_LOOPS; loop++) {
		memcpy(ctx->tmp_buf, pcm, ctx->size * sizeof(FLOAT));

		// Use VLA for a while
		FLOAT BA[dim][ctx->size];
		FLOAT Bw[dim][ctx->size];
		FLOAT Bp[dim][ctx->size];
		FLOAT BAw[dim][ctx->size];
		FLOAT BAp[dim][ctx->size];
		FLOAT Bww[dim][ctx->size];
		FLOAT Bwp[dim][ctx->size];
		FLOAT Bpp[dim][ctx->size];

		for (n = 0; n < ctx->size; n++) {
			for (k = 0; k < dim; k++) {
				FLOAT Ak = (info+k)->magnitude;
				FLOAT wk = (info+k)->frequency;
				FLOAT pk = (info+k)->phase;
				FLOAT s = sin(wk * n + pk);
				FLOAT c = cos(wk * n + pk);
				ctx->tmp_buf[n] -= Ak * s;

				BA[k][n] = -s;
				Bw[k][n] = -Ak * n * c;
				Bp[k][n] = -Ak * c;

				BAw[k][n] = -n * c;
				BAp[k][n] = -c;
				Bww[k][n] = Ak * n * n * s;
				Bwp[k][n] = Ak * n * s;
				Bpp[k][n] = Ak * s;

			}
		}

		double M[dim * 3][dim * 3 + 1];
		memset(M, '\0', dim * 3 * (dim * 3 + 1) * sizeof(double));
		for (i = 0; i < dim; i++) {
			for (j = 0; j < dim; j++) {
				for (n = 0; n < ctx->size; n++) {
					if (i == j) {
						M[i + dim * 0][j + dim * 0] += BA[i][n] * BA[i][n];
						M[i + dim * 0][j + dim * 1] += ctx->tmp_buf[n] * BAw[i][n] + BA[i][n] * Bw[i][n];
						M[i + dim * 0][j + dim * 2] += ctx->tmp_buf[n] * BAp[i][n] + BA[i][n] * Bp[i][n];

						M[i + dim * 1][j + dim * 1] += ctx->tmp_buf[n] * Bww[i][n] + Bw[i][n] * Bw[i][n];
						M[i + dim * 1][j + dim * 2] += ctx->tmp_buf[n] * Bwp[i][n] + Bw[i][n] * Bp[i][n];

						M[i + dim * 2][j + dim * 2] += ctx->tmp_buf[n] * Bpp[i][n] + Bp[i][n] * Bp[i][n];
					} else {
						M[i + dim * 0][j + dim * 0] += BA[i][n] * BA[j][n];
						M[i + dim * 0][j + dim * 1] += BA[i][n] * Bw[j][n];
						M[i + dim * 0][j + dim * 2] += BA[i][n] * Bp[j][n];

						M[i + dim * 1][j + dim * 1] += Bw[i][n] * Bw[j][n];
						M[i + dim * 1][j + dim * 2] += Bw[i][n] * Bp[j][n];

						M[i + dim * 2][j + dim * 2] += Bp[i][n] * Bp[j][n];
					}
				}
				M[i + dim * 0][j + dim * 0] *= 2;
				M[i + dim * 0][j + dim * 1] *= 2;
				M[i + dim * 0][j + dim * 2] *= 2;

				M[i + dim * 1][j + dim * 1] *= 2;
				M[i + dim * 1][j + dim * 2] *= 2;

				M[i + dim * 2][j + dim * 2] *= 2;


				M[i + dim * 0][j + dim * 1] = M[i + dim * 1][j + dim * 0];
				M[i + dim * 0][j + dim * 2] = M[i + dim * 2][j + dim * 0];
				M[i + dim * 1][j + dim * 2] = M[i + dim * 2][j + dim * 1];
			}
		}

		for (k = 0; k < dim; k++) {
			for (n = 0; n < ctx->size; n++) {
				M[k + dim * 0][dim * 3] += ctx->tmp_buf[n] * BA[k][n];
				M[k + dim * 1][dim * 3] += ctx->tmp_buf[n] * Bw[k][n];
				M[k + dim * 2][dim * 3] += ctx->tmp_buf[n] * Bp[k][n];
			}
			M[k + dim * 0][dim * 3] *= 2;
			M[k + dim * 1][dim * 3] *= 2;
			M[k + dim * 2][dim * 3] *= 2;
		}

		double fx0[dim * 3];
		memset(fx0, '\0', dim * 3 * sizeof(double));
		if(sle_solve(&M[0][0], dim * 3, fx0)) {
			return -1;
		}

		for (k = 0; k < dim; k++) {
			//fprintf(stderr, "delta1: %f\n", fx0[k + dim * 0]);
			//fprintf(stderr, "delta2: %f\n", fx0[k + dim * 1]);
			//fprintf(stderr, "delta3: %f\n", fx0[k + dim * 2]);
			(info+k)->magnitude -= (fx0[k + dim * 0] * 0.8);
			(info+k)->frequency -= (fx0[k + dim * 1] * 0.8);
			(info+k)->phase -=     (fx0[k + dim * 2] * 0.8);
		}

		for (k = 0; k < dim; k++) {
			if ((info+k)->magnitude < 0) {
				(info+k)->magnitude *= -1;
				(info+k)->phase += M_PI;
			}

			if ((info+k)->magnitude > 1) {
				//TODO: ???
				(info+k)->magnitude = 0.5;
			}
		}

		for (k = 0; k < dim; k++) {
			if ((info + k)->frequency < 0) {
				//fprintf(stderr, "negative freq\n");
				(info + k)->frequency *= -1;
				(info + k)->phase = 2 * M_PI - (info + k)->phase;
			}
			while ((info + k)->frequency > M_PI * 2.0) {
				//fprintf(stderr, "freq over\n");
				(info + k)->frequency -= M_PI * 2.0;
			}
			if ((info + k)->frequency > M_PI) {
				//fprintf(stderr, "freq ??\n");
				(info + k)->frequency = 2 * M_PI - (info + k)->frequency;
			}
		}

		for (k = 0; k < dim; k++) {
			while ((info+k)->phase > M_PI * 2.0) {
				(info+k)->phase -= M_PI * 2;
			}
			while ((info + k)->phase < 0) {
				(info+k)->phase += M_PI * 2;
			}
		}
	}
	return 0;
}